

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void optionvalues(TidyDoc tdoc)

{
  ctmbstr ptVar1;
  ctmbstr ptVar2;
  ctmbstr ptVar3;
  
  ptVar1 = tidyLocalizedString(0x33d);
  printf("\n%s\n",ptVar1);
  ptVar1 = tidyLocalizedString(0x33e);
  ptVar2 = tidyLocalizedString(0x33f);
  ptVar3 = tidyLocalizedString(0x340);
  printf("%-27.27s %-9.9s  %-40.40s\n",ptVar1,ptVar2,ptVar3);
  printf("%-27.27s %-9.9s  %-40.40s\n",
         "=================================================================",
         "=================================================================");
  ForEachSortedOption(tdoc,printOptionValues);
  return;
}

Assistant:

static void optionvalues( TidyDoc tdoc )
{
    printf( "\n%s\n", tidyLocalizedString(TC_STRING_CONF_HEADER) );
    printf( fmt, tidyLocalizedString(TC_STRING_CONF_NAME),
           tidyLocalizedString(TC_STRING_CONF_TYPE),
           tidyLocalizedString(TC_STRING_CONF_VALUE) );
    printf( fmt, ul, ul, ul );

    ForEachSortedOption( tdoc, printOptionValues );
}